

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **pp,char **pzErrMsg)

{
  int iVar1;
  
  iVar1 = fts5StorageGetStmt(p,eStmt,pp,pzErrMsg);
  if (iVar1 == 0) {
    p->aStmt[(uint)eStmt] = (sqlite3_stmt *)0x0;
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageStmt(
  Fts5Storage *p,
  int eStmt,
  sqlite3_stmt **pp,
  char **pzErrMsg
){
  int rc;
  assert( eStmt==FTS5_STMT_SCAN_ASC
       || eStmt==FTS5_STMT_SCAN_DESC
       || eStmt==FTS5_STMT_LOOKUP
  );
  rc = fts5StorageGetStmt(p, eStmt, pp, pzErrMsg);
  if( rc==SQLITE_OK ){
    assert( p->aStmt[eStmt]==*pp );
    p->aStmt[eStmt] = 0;
  }
  return rc;
}